

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O3

void __thiscall addrman_tests::getaddr_unfiltered::test_method(getaddr_unfiltered *this)

{
  __single_object this_00;
  readonly_property65 rVar1;
  int32_t consistency_check_ratio;
  __uniq_ptr_data<AddrMan,_std::default_delete<AddrMan>,_true,_true> this_01;
  time_point tVar2;
  long lVar3;
  iterator in_R8;
  iterator pvVar4;
  iterator in_R9;
  iterator pvVar5;
  long in_FS_OFFSET;
  const_string file;
  initializer_list<CAddress> __l;
  const_string file_00;
  const_string file_01;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  check_type cVar6;
  undefined1 *local_2a0;
  undefined1 *local_298;
  char *local_290;
  char *local_288;
  undefined4 local_27c;
  vector<CAddress,_std::allocator<CAddress>_> local_278;
  long local_260;
  assertion_result local_258;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  __single_object addrman;
  undefined4 *local_1e0;
  lazy_ostream local_1d8;
  undefined1 *local_1c8;
  vector<CAddress,_std::allocator<CAddress>_> *local_1c0;
  long *local_1b8;
  char *local_1b0;
  char *local_1a8;
  assertion_result local_1a0;
  direct_or_indirect local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  undefined2 local_168;
  long local_160;
  undefined8 uStack_158;
  prevector<16U,_unsigned_char,_unsigned_int,_int> local_150;
  undefined8 local_138;
  undefined2 local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  direct_or_indirect local_118;
  uint local_108;
  direct_or_indirect local_f8;
  uint local_e8;
  undefined8 local_e0;
  undefined2 local_d8;
  direct_or_indirect local_d0;
  uint local_c0;
  undefined8 local_b8;
  undefined2 local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  direct_or_indirect local_98;
  uint local_88;
  undefined8 local_80;
  undefined2 local_78;
  direct_or_indirect local_70;
  uint local_60;
  undefined8 local_58;
  undefined2 local_50;
  long local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  consistency_check_ratio =
       GetCheckRatio((NodeContext *)(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_node.args);
  this_01.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl =
       (__uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>)operator_new(8);
  AddrMan::AddrMan((AddrMan *)
                   this_01.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                   super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                   super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&EMPTY_NETGROUPMAN,true,
                   consistency_check_ratio);
  addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl =
       (__uniq_ptr_data<AddrMan,_std::default_delete<AddrMan>,_true,_true>)
       (__uniq_ptr_data<AddrMan,_std::default_delete<AddrMan>,_true,_true>)
       this_01.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
       super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl;
  local_188.indirect_contents.indirect = (char *)&local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"250.250.2.1","");
  ResolveService((CService *)&local_98.indirect_contents,(string *)&local_188.indirect_contents,
                 0x208d);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_70.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_98.indirect_contents);
  local_58 = local_80;
  local_50 = local_78;
  local_48 = 100000000;
  uStack_40 = 0;
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
    local_98.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188.indirect_contents.indirect != &local_178) {
    operator_delete(local_188.indirect_contents.indirect,local_178._M_allocated_capacity + 1);
  }
  tVar2 = NodeClock::now();
  local_48 = (long)tVar2.__d.__r / 1000000000;
  local_188.indirect_contents.indirect = (char *)&local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"250.251.2.2","");
  ResolveService((CService *)&local_f8.indirect_contents,(string *)&local_188.indirect_contents,9999
                );
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_d0.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_f8.indirect_contents);
  local_b8 = local_e0;
  local_b0 = local_d8;
  local_a8 = 100000000;
  uStack_a0 = 0;
  if (0x10 < local_e8) {
    free(local_f8.indirect_contents.indirect);
    local_f8.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188.indirect_contents.indirect != &local_178) {
    operator_delete(local_188.indirect_contents.indirect,local_178._M_allocated_capacity + 1);
  }
  local_188.indirect_contents.indirect = (char *)&local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"250.1.2.1","");
  ResolveIP((CNetAddr *)&local_118.indirect_contents,(string *)&local_188.indirect_contents);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188.indirect_contents.indirect != &local_178) {
    operator_delete(local_188.indirect_contents.indirect,local_178._M_allocated_capacity + 1);
  }
  local_1f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_1f0 = "";
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x1bd;
  file.m_begin = (iterator)&local_1f8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_208,msg);
  this_00 = addrman;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_188.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_70.indirect_contents);
  local_178._8_8_ = local_58;
  local_168 = local_50;
  local_160 = local_48;
  uStack_158 = uStack_40;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            (&local_150,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_d0.indirect_contents);
  local_138 = local_b8;
  local_130 = local_b0;
  local_128 = local_a8;
  uStack_120 = uStack_a0;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_188;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_1a0,__l,
             (allocator_type *)&local_1b0);
  _cVar6 = 0x22ee77;
  rVar1.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       AddrMan::Add((AddrMan *)
                    this_00._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                    super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                    super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                    (vector<CAddress,_std::allocator<CAddress>_> *)&local_1a0,
                    (CNetAddr *)&local_118.indirect_contents,(seconds)0x0);
  local_258.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       rVar1.super_readonly_property<bool>.super_class_property<bool>.value;
  local_258.m_message.px = (element_type *)0x0;
  local_258.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c0 = &local_278;
  local_278.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xe5a718;
  local_278.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xe5a73c;
  local_1d8.m_empty = false;
  local_1d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_1c8 = boost::unit_test::lazy_ostream::inst;
  local_218 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_210 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_258,&local_1d8,1,0,WARN,_cVar6,(size_t)&local_218,0x1bd);
  boost::detail::shared_count::~shared_count(&local_258.m_message.pn);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_1a0);
  lVar3 = 0x38;
  do {
    if (0x10 < *(uint *)((long)&local_178 + lVar3)) {
      free(*(void **)((long)&local_188 + lVar3));
      *(undefined8 *)((long)&local_188 + lVar3) = 0;
    }
    lVar3 = lVar3 + -0x38;
  } while (lVar3 != -0x38);
  local_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_220 = "";
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x1c0;
  file_00.m_begin = (iterator)&local_228;
  msg_00.m_end = pvVar5;
  msg_00.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_238,
             msg_00);
  local_258.m_message.px = (element_type *)((ulong)local_258.m_message.px & 0xffffffffffffff00);
  local_258._0_8_ = &PTR__lazy_ostream_013ae088;
  local_258.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_240 = "";
  AddrMan::GetAddr(&local_278,
                   (AddrMan *)
                   addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                   super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                   super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,0,0,(optional<Network>)0x0,
                   true);
  local_260 = ((long)local_278.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_278.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
  local_1b8 = &local_260;
  local_1e0 = &local_27c;
  local_27c = 1;
  local_1a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((long)local_278.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_278.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
              super__Vector_impl_data._M_start == 0x38);
  local_1a0.m_message.px = (element_type *)0x0;
  local_1a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_1a8 = "";
  local_188.direct[8] = '\0';
  local_188.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae0c8;
  local_178._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_1d8.m_empty = false;
  local_1d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae108;
  local_1c8 = boost::unit_test::lazy_ostream::inst;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_1c0 = (vector<CAddress,_std::allocator<CAddress>_> *)&local_1e0;
  local_178._8_8_ = &local_1b8;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a0,(lazy_ostream *)&local_258,1,2,REQUIRE,0xe5a67f,(size_t)&local_1b0,0x1c0,
             &local_188,"1U",&local_1d8);
  boost::detail::shared_count::~shared_count(&local_1a0.m_message.pn);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&local_278);
  local_290 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_288 = "";
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x1c2;
  file_01.m_begin = (iterator)&local_290;
  msg_01.m_end = pvVar5;
  msg_01.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_2a0,
             msg_01);
  local_258.m_message.px = (element_type *)((ulong)local_258.m_message.px & 0xffffffffffffff00);
  local_258._0_8_ = &PTR__lazy_ostream_013ae088;
  local_258.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_240 = "";
  AddrMan::GetAddr(&local_278,
                   (AddrMan *)
                   addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                   super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                   super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,0,0,(optional<Network>)0x0,
                   false);
  local_260 = ((long)local_278.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_278.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
  local_27c = 2;
  local_1a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((long)local_278.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_278.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
              super__Vector_impl_data._M_start == 0x70);
  local_1a0.m_message.px = (element_type *)0x0;
  local_1a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_1a8 = "";
  local_1b8 = &local_260;
  local_188.direct[8] = '\0';
  local_188.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae0c8;
  local_178._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_1e0 = &local_27c;
  local_1d8.m_empty = false;
  local_1d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae108;
  local_1c8 = boost::unit_test::lazy_ostream::inst;
  local_1c0 = (vector<CAddress,_std::allocator<CAddress>_> *)&local_1e0;
  local_178._8_8_ = &local_1b8;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a0,(lazy_ostream *)&local_258,1,2,REQUIRE,0xe5a73d,(size_t)&local_1b0,0x1c2,
             &local_188,"2U",&local_1d8);
  boost::detail::shared_count::~shared_count(&local_1a0.m_message.pn);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&local_278);
  if (0x10 < local_108) {
    free(local_118.indirect_contents.indirect);
  }
  if (0x10 < local_c0) {
    free(local_d0.indirect_contents.indirect);
  }
  if (0x10 < local_60) {
    free(local_70.indirect_contents.indirect);
  }
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::~unique_ptr(&addrman);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(getaddr_unfiltered)
{
    auto addrman = std::make_unique<AddrMan>(EMPTY_NETGROUPMAN, DETERMINISTIC, GetCheckRatio(m_node));

    // Set time on this addr so isTerrible = false
    CAddress addr1 = CAddress(ResolveService("250.250.2.1", 8333), NODE_NONE);
    addr1.nTime = Now<NodeSeconds>();
    // Not setting time so this addr should be isTerrible = true
    CAddress addr2 = CAddress(ResolveService("250.251.2.2", 9999), NODE_NONE);

    CNetAddr source = ResolveIP("250.1.2.1");
    BOOST_CHECK(addrman->Add({addr1, addr2}, source));

    // Filtered GetAddr should only return addr1
    BOOST_CHECK_EQUAL(addrman->GetAddr(/*max_addresses=*/0, /*max_pct=*/0, /*network=*/std::nullopt).size(), 1U);
    // Unfiltered GetAddr should return addr1 and addr2
    BOOST_CHECK_EQUAL(addrman->GetAddr(/*max_addresses=*/0, /*max_pct=*/0, /*network=*/std::nullopt, /*filtered=*/false).size(), 2U);
}